

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O1

void __thiscall
qclab::qgates::QControlledGate2<double>::apply
          (QControlledGate2<double> *this,Side side,Op op,int nbQubits,SquareMatrix<double> *matrix,
          int offset)

{
  double dVar1;
  double dVar2;
  QControlledGate2<double> *pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  long lVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  char *__assertion;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  matrix_type mat1;
  vector<int,_std::allocator<int>_> qubits;
  long local_a8;
  long local_98;
  long local_80;
  double *local_78;
  QControlledGate2<double> *local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  int *local_48 [2];
  long local_38;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                  ,0x2e,
                  "virtual void qclab::qgates::QControlledGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                  ,0x2f,
                  "virtual void qclab::qgates::QControlledGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[5])(local_48,this);
  iVar4 = *local_48[0];
  *local_48[0] = iVar4 + offset;
  iVar5 = local_48[0][1];
  local_48[0][1] = offset + iVar5;
  if (iVar4 + offset < nbQubits) {
    if (offset + iVar5 < nbQubits) {
      local_70 = this;
      iVar4 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0x10])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x38))(&local_80);
      pQVar3 = local_70;
      if ((op != NoTrans) && (1 < local_80)) {
        pdVar12 = local_78 + local_80;
        pdVar9 = local_78;
        lVar8 = 0;
        do {
          lVar18 = 1;
          pdVar11 = pdVar12;
          do {
            dVar1 = pdVar9[lVar18];
            pdVar9[lVar18] = *pdVar11;
            *pdVar11 = dVar1;
            lVar16 = lVar8 + lVar18;
            lVar18 = lVar18 + 1;
            pdVar11 = pdVar11 + local_80;
          } while (lVar16 + 1 < local_80);
          pdVar12 = pdVar12 + local_80 + 1;
          pdVar9 = pdVar9 + local_80 + 1;
          bVar21 = lVar8 != local_80 + -2;
          lVar8 = lVar8 + 1;
        } while (bVar21);
      }
      iVar4 = local_70->control_;
      iVar5 = (*(local_70->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(local_70)
      ;
      if (iVar4 < iVar5) {
        iVar5 = (*(pQVar3->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(pQVar3);
        iVar4 = pQVar3->control_;
        iVar6 = (*(pQVar3->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(pQVar3);
        uVar7 = (*(pQVar3->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(pQVar3);
        lVar18 = (long)(1 << ((char)iVar5 - (char)iVar4 & 0x1fU));
        iVar4 = ~uVar7 + nbQubits;
        lVar8 = (long)(1 << ((byte)iVar6 & 0x1f));
        lVar16 = (long)(1 << ((byte)iVar4 & 0x1f));
        local_60 = matrix->size_;
        if (side == Left) {
          if (0 < local_60) {
            lVar17 = 1;
            if (1 < lVar16) {
              lVar17 = lVar16;
            }
            lVar19 = 1;
            if (1 < lVar8) {
              lVar19 = lVar8;
            }
            iVar5 = local_70->controlState_;
            lVar20 = 0;
            lVar8 = 0;
            do {
              if (iVar6 != 0x1f) {
                pdVar12 = (matrix->data_)._M_t.
                          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                          super__Head_base<0UL,_double_*,_false>._M_head_impl;
                lVar15 = lVar16 * local_60 * 8 + lVar20;
                lVar13 = 0;
                do {
                  if (iVar5 == 1) {
                    if (lVar18 / 2 <= lVar13 % lVar18) goto LAB_00131f6f;
                  }
                  else if ((iVar5 != 0) || (lVar13 % lVar18 < lVar18 / 2)) {
LAB_00131f6f:
                    pdVar9 = pdVar12;
                    lVar10 = lVar17;
                    if (iVar4 != 0x1f) {
                      do {
                        dVar1 = *(double *)((long)pdVar9 + lVar20);
                        dVar2 = *(double *)((long)pdVar9 + lVar15);
                        *(double *)((long)pdVar9 + lVar20) = *local_78 * dVar1 + local_78[1] * dVar2
                        ;
                        *(double *)((long)pdVar9 + lVar15) =
                             dVar1 * local_78[local_80] + dVar2 * local_78[local_80 + 1];
                        lVar10 = lVar10 + -1;
                        pdVar9 = pdVar9 + local_60;
                      } while (lVar10 != 0);
                    }
                  }
                  lVar13 = lVar13 + 1;
                  pdVar12 = pdVar12 + lVar16 * local_60 * 2;
                } while (lVar13 != lVar19);
              }
              lVar8 = lVar8 + 1;
              lVar20 = lVar20 + 8;
            } while (lVar8 != local_60);
          }
        }
        else if (0 < local_60) {
          iVar5 = local_70->controlState_;
          lVar17 = 1;
          if (1 < lVar16) {
            lVar17 = lVar16;
          }
          lVar19 = 1;
          if (1 < lVar8) {
            lVar19 = lVar8;
          }
          local_a8 = lVar16 * 8;
          local_98 = 0;
          lVar8 = 0;
          do {
            if (iVar6 != 0x1f) {
              pdVar12 = (matrix->data_)._M_t.
                        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                        super__Head_base<0UL,_double_*,_false>._M_head_impl;
              lVar20 = local_a8 + (long)pdVar12;
              lVar13 = (long)pdVar12 + local_98;
              lVar15 = 0;
              do {
                if (iVar5 == 1) {
                  if (lVar18 / 2 <= lVar15 % lVar18) goto LAB_001323b4;
                }
                else if ((iVar5 != 0) || (lVar15 % lVar18 < lVar18 / 2)) {
LAB_001323b4:
                  if (iVar4 != 0x1f) {
                    lVar10 = 0;
                    do {
                      dVar1 = *(double *)(lVar13 + lVar10 * 8);
                      dVar2 = *(double *)(lVar20 + lVar10 * 8);
                      *(double *)(lVar13 + lVar10 * 8) =
                           *local_78 * dVar1 + local_78[local_80] * dVar2;
                      *(double *)(lVar20 + lVar10 * 8) =
                           dVar1 * local_78[1] + dVar2 * local_78[local_80 + 1];
                      lVar10 = lVar10 + 1;
                    } while (lVar17 != lVar10);
                  }
                }
                lVar15 = lVar15 + 1;
                lVar20 = lVar20 + lVar16 * 0x10;
                lVar13 = lVar13 + lVar16 * 0x10;
              } while (lVar15 != lVar19);
            }
            lVar8 = lVar8 + 1;
            local_a8 = local_a8 + local_60 * 8;
            local_98 = local_98 + local_60 * 8;
          } while (lVar8 != local_60);
        }
      }
      else {
        iVar4 = pQVar3->control_;
        iVar5 = (*(pQVar3->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(pQVar3);
        uVar7 = (*(pQVar3->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(pQVar3);
        local_60 = CONCAT44(local_60._4_4_,iVar5);
        lVar16 = (long)(1 << ((byte)nbQubits - (char)iVar4 & 0x1f));
        iVar4 = ~uVar7 + nbQubits;
        lVar18 = (long)(1 << ((byte)iVar5 & 0x1f));
        lVar17 = (long)(1 << ((byte)iVar4 & 0x1f));
        lVar8 = matrix->size_;
        if (side == Left) {
          if (0 < lVar8) {
            lVar19 = 1;
            if (1 < lVar17) {
              lVar19 = lVar17;
            }
            lVar20 = 1;
            if (1 < lVar18) {
              lVar20 = lVar18;
            }
            local_68 = 0;
            lVar18 = 0;
            do {
              local_58 = lVar18;
              if (iVar5 != 0x1f) {
                iVar6 = local_70->controlState_;
                lVar15 = 0;
                lVar18 = local_68;
                do {
                  if (iVar4 != 0x1f) {
                    pdVar12 = (matrix->data_)._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl;
                    lVar13 = lVar17 * lVar8 * 8 + lVar18;
                    lVar10 = 0;
                    do {
                      if (iVar6 == 1) {
                        if (lVar16 / 2 <= lVar10 % lVar16) goto LAB_00132124;
                      }
                      else if ((iVar6 != 0) || (lVar10 % lVar16 < lVar16 / 2)) {
LAB_00132124:
                        dVar1 = *(double *)((long)pdVar12 + lVar18);
                        dVar2 = *(double *)((long)pdVar12 + lVar13);
                        *(double *)((long)pdVar12 + lVar18) =
                             *local_78 * dVar1 + local_78[1] * dVar2;
                        *(double *)((long)pdVar12 + lVar13) =
                             dVar1 * local_78[local_80] + dVar2 * local_78[local_80 + 1];
                      }
                      lVar10 = lVar10 + 1;
                      pdVar12 = pdVar12 + lVar8;
                    } while (lVar19 != lVar10);
                  }
                  lVar15 = lVar15 + 1;
                  lVar18 = lVar18 + lVar17 * lVar8 * 0x10;
                } while (lVar15 != lVar20);
              }
              local_68 = local_68 + 8;
              lVar18 = local_58 + 1;
            } while (local_58 + 1 != lVar8);
          }
        }
        else if (0 < lVar8) {
          lVar19 = 1;
          if (1 < lVar17) {
            lVar19 = lVar17;
          }
          lVar20 = 1;
          if (1 < lVar18) {
            lVar20 = lVar18;
          }
          local_58 = lVar17 * 8;
          local_50 = lVar8 * 8;
          local_68 = 0;
          lVar18 = 0;
          do {
            if (iVar5 != 0x1f) {
              iVar6 = local_70->controlState_;
              lVar10 = 0;
              lVar15 = local_58;
              lVar13 = local_68;
              do {
                if (iVar4 != 0x1f) {
                  pdVar12 = (matrix->data_)._M_t.
                            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                            super__Head_base<0UL,_double_*,_false>._M_head_impl;
                  lVar14 = 0;
                  do {
                    if (iVar6 == 1) {
                      if (lVar16 / 2 <= lVar14 % lVar16) goto LAB_00132279;
                    }
                    else if ((iVar6 != 0) || (lVar14 % lVar16 < lVar16 / 2)) {
LAB_00132279:
                      dVar1 = *(double *)((long)pdVar12 + lVar14 * 8 + lVar13);
                      dVar2 = *(double *)((long)pdVar12 + lVar14 * 8 + lVar15);
                      *(double *)((long)pdVar12 + lVar14 * 8 + lVar13) =
                           *local_78 * dVar1 + local_78[local_80] * dVar2;
                      *(double *)((long)pdVar12 + lVar14 * 8 + lVar15) =
                           dVar1 * local_78[1] + dVar2 * local_78[local_80 + 1];
                    }
                    lVar14 = lVar14 + 1;
                  } while (lVar19 != lVar14);
                }
                lVar10 = lVar10 + 1;
                lVar15 = lVar15 + lVar17 * 0x10;
                lVar13 = lVar13 + lVar17 * 0x10;
              } while (lVar10 != lVar20);
            }
            lVar18 = lVar18 + 1;
            local_58 = local_58 + local_50;
            local_68 = local_68 + local_50;
          } while (lVar18 != lVar8);
        }
      }
      if (local_78 != (double *)0x0) {
        operator_delete__(local_78);
      }
      if (local_48[0] != (int *)0x0) {
        operator_delete(local_48[0],local_38 - (long)local_48[0]);
      }
      return;
    }
    __assertion = "qubits[1] < nbQubits";
  }
  else {
    __assertion = "qubits[0] < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                ,0x33,
                "virtual void qclab::qgates::QControlledGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
               );
}

Assistant:

void QControlledGate2< T >::apply( Side side , Op op , const int nbQubits ,
                                     qclab::dense::SquareMatrix< T >& matrix ,
                                     const int offset ) const {
    using matrix_type = qclab::dense::SquareMatrix< T > ;
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    // operation
    matrix_type  mat1 = this->gate()->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // control / target
    if ( control() < target() ) {
      // control() < target()
      const int64_t d = 1 << ( target() - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      // control() >= target()
      const int64_t d = 1 << ( nbQubits - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.cols(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              if ( controlState_ == 0 && ( j % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( j % d <  d/2 ) ) continue ;
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              if ( controlState_ == 0 && ( i % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( i % d <  d/2 ) ) continue ;
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }